

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O1

bool deqp::gls::BufferTestUtil::compareByteArrays
               (TestLog *log,deUint8 *resPtr,deUint8 *refPtr,int numBytes)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ostringstream *poVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  string local_1f8;
  string local_1d8;
  ulong local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Verify","");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Verification result","");
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1d8,&local_1f8);
  tcu::TestLog::startSection(log,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (numBytes < 1) {
    bVar1 = true;
    uVar10 = 0;
    uVar4 = 0xffffffff;
    bVar11 = true;
  }
  else {
    uVar2 = (ulong)(uint)numBytes;
    uVar5 = 0xffffffff;
    uVar10 = 0;
    bVar11 = true;
    iVar3 = 0;
    local_1b8 = uVar2;
    do {
      poVar7 = (ostringstream *)(local_1b0 + 8);
      iVar9 = (int)uVar5;
      if (resPtr[uVar10] == refPtr[uVar10]) {
        if (-1 < iVar9) {
          if (iVar3 < 4) {
            iVar6 = (int)uVar10 - iVar9;
            iVar12 = 8;
            if (iVar6 < 8) {
              iVar12 = iVar6;
            }
            poVar7 = (ostringstream *)(local_1b0 + 8);
            local_1b0._0_8_ = log;
            std::__cxx11::ostringstream::ostringstream(poVar7);
            std::ostream::operator<<(poVar7,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar7," byte difference at offset ",0x1b);
            std::ostream::operator<<(poVar7,iVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"  expected ",0xb);
            local_1d8._M_dataplus._M_p = (pointer)(refPtr + uVar5);
            local_1d8._M_string_length = (size_type)(local_1d8._M_dataplus._M_p + iVar12);
            tcu::Format::operator<<
                      ((ostream *)poVar7,
                       (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                       &local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"  got ",6);
            local_1f8._M_dataplus._M_p = (pointer)(resPtr + uVar5);
            local_1f8._M_string_length = (size_type)(local_1f8._M_dataplus._M_p + iVar12);
            tcu::Format::operator<<
                      ((ostream *)poVar7,
                       (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                       &local_1f8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
            std::ios_base::~ios_base(local_138);
          }
          else {
            local_1b0._0_8_ = log;
            std::__cxx11::ostringstream::ostringstream(poVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar7,"(output too long, truncated)",0x1c);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar7);
            std::ios_base::~ios_base(local_138);
          }
          iVar3 = iVar3 + 1;
          uVar5 = 0xffffffff;
          uVar2 = local_1b8;
        }
      }
      else {
        if (iVar9 < 0) {
          uVar5 = uVar10 & 0xffffffff;
        }
        bVar11 = false;
      }
      uVar4 = (uint)uVar5;
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
    bVar1 = iVar3 < 4;
  }
  if (-1 < (int)uVar4) {
    if (bVar1) {
      iVar9 = (int)uVar10 - uVar4;
      iVar3 = 8;
      if (iVar9 < 8) {
        iVar3 = iVar9;
      }
      poVar7 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar7);
      std::ostream::operator<<(poVar7,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar7," byte difference at offset ",0x1b);
      std::ostream::operator<<(poVar7,uVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"  expected ",0xb);
      local_1d8._M_dataplus._M_p = (pointer)(refPtr + uVar4);
      local_1d8._M_string_length = (size_type)(local_1d8._M_dataplus._M_p + iVar3);
      tcu::Format::operator<<
                ((ostream *)poVar7,
                 (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                 &local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"  got ",6);
      local_1f8._M_dataplus._M_p = (pointer)(resPtr + uVar4);
      local_1f8._M_string_length = (size_type)(local_1f8._M_dataplus._M_p + iVar3);
      tcu::Format::operator<<
                ((ostream *)poVar7,
                 (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                 &local_1f8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar7);
      std::ios_base::~ios_base(local_138);
    }
    else {
      poVar7 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar7,"(output too long, truncated)",0x1c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar7);
      std::ios_base::~ios_base(local_138);
    }
  }
  poVar7 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar7);
  pcVar8 = "Verification FAILED!";
  if (bVar11) {
    pcVar8 = "Verification passed.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,pcVar8,0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar7);
  std::ios_base::~ios_base(local_138);
  tcu::TestLog::endSection(log);
  return bVar11;
}

Assistant:

bool compareByteArrays (tcu::TestLog& log, const deUint8* resPtr, const deUint8* refPtr, int numBytes)
{
	bool			isOk			= true;
	const int		maxSpanLen		= 8;
	const int		maxDiffSpans	= 4;
	int				numDiffSpans	= 0;
	int				diffSpanStart	= -1;
	int				ndx				= 0;

	log << TestLog::Section("Verify", "Verification result");

	for (;ndx < numBytes; ndx++)
	{
		if (resPtr[ndx] != refPtr[ndx])
		{
			if (diffSpanStart < 0)
				diffSpanStart = ndx;

			isOk = false;
		}
		else if (diffSpanStart >= 0)
		{
			if (numDiffSpans < maxDiffSpans)
			{
				int len			= ndx-diffSpanStart;
				int	printLen	= de::min(len, maxSpanLen);

				log << TestLog::Message << len << " byte difference at offset " << diffSpanStart << "\n"
										<< "  expected "	<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart+printLen)) << "\n"
										<< "  got "			<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart+printLen))
					<< TestLog::EndMessage;
			}
			else
				log << TestLog::Message << "(output too long, truncated)" << TestLog::EndMessage;

			numDiffSpans	+= 1;
			diffSpanStart	 = -1;
		}
	}

	if (diffSpanStart >= 0)
	{
		if (numDiffSpans < maxDiffSpans)
		{
				int len			= ndx-diffSpanStart;
				int	printLen	= de::min(len, maxSpanLen);

				log << TestLog::Message << len << " byte difference at offset " << diffSpanStart << "\n"
										<< "  expected "	<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart+printLen)) << "\n"
										<< "  got "			<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart+printLen))
					<< TestLog::EndMessage;
		}
		else
			log << TestLog::Message << "(output too long, truncated)" << TestLog::EndMessage;
	}

	log << TestLog::Message << (isOk ? "Verification passed." : "Verification FAILED!") << TestLog::EndMessage;
	log << TestLog::EndSection;

	return isOk;
}